

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastPop
          (Lowerer *this,Opnd *baseOpndParam,Instr *callInstr,LabelInstr *labelHelper,
          LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ValueType VVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  StackSym *pSVar7;
  RegOpnd *opnd;
  RegOpnd *indexOpnd;
  IntConstOpnd *pIVar8;
  IndirOpnd *pIVar9;
  Lowerer *this_00;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseBaseOpnd;
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  AutoReuseOpnd autoReuseMutableArrayLengthOpnd;
  bool local_35;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  bool local_31 [4];
  bool isStringIndex;
  ValueType arrValueType;
  bool isTypedArrayElement;
  
  bVar2 = ShouldGenerateArrayFastPath(this,baseOpndParam,false,false,false);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5320,"(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false))",
                       "ShouldGenerateArrayFastPath(baseOpndParam, false, false, false)");
    if (!bVar2) goto LAB_005eb25b;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(baseOpndParam);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005eb25b;
    *puVar5 = 0;
  }
  local_a8 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_a8,baseOpndParam,this->m_func,true);
  local_34 = (baseOpndParam->m_valueType).field_0;
  autoReuseArrayOpnd.autoDelete = false;
  autoReuseArrayOpnd.wasInUse = false;
  autoReuseArrayOpnd._18_6_ = 0;
  autoReuseArrayLengthOpnd.func._1_1_ = 1;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_34.field_0);
  if (bVar2) {
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)baseOpndParam);
    if (!bVar2) goto LAB_005eaff5;
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)baseOpndParam);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar2) goto LAB_005eb25b;
      *puVar5 = 0;
    }
    pSVar6 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    if (pSVar6 == (StackSym *)0x0) goto LAB_005eaff5;
    pSVar6 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    pSVar7 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)baseOpndParam);
    opnd = IR::RegOpnd::New(pSVar6,pSVar7->m_type,this->m_func);
    opnd->field_0x18 = opnd->field_0x18 | 0x40;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&opnd->super_Opnd,this->m_func,true);
  }
  else {
    baseOpndParam =
         &GenerateArrayTest(this,(RegOpnd *)baseOpndParam,bailOutLabelHelper,bailOutLabelHelper,
                            callInstr,false,true,false)->super_Opnd;
    autoReuseArrayLengthOpnd._16_2_ =
         (((RegOpnd *)baseOpndParam)->super_Opnd).m_valueType.field_0.bits;
    VVar4 = ValueType::ToDefiniteObject((ValueType *)&autoReuseArrayLengthOpnd.autoDelete);
    autoReuseBaseOpnd._16_2_ = VVar4.field_0;
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&autoReuseBaseOpnd.autoDelete,false);
LAB_005eaff5:
    opnd = (RegOpnd *)0x0;
  }
  autoReuseBaseOpnd.autoDelete = false;
  autoReuseBaseOpnd.wasInUse = false;
  autoReuseBaseOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseBaseOpnd.autoDelete,baseOpndParam,this->m_func,true);
  autoReuseArrayLengthOpnd.autoDelete = false;
  autoReuseArrayLengthOpnd.wasInUse = false;
  autoReuseArrayLengthOpnd._18_6_ = 0;
  indexOpnd = IR::RegOpnd::New(TyUint32,this->m_func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete,&indexOpnd->super_Opnd,
             this->m_func,true);
  if (opnd == (RegOpnd *)0x0) {
    pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpndParam,0x20,(indexOpnd->super_Opnd).m_type,
                                this->m_func,false);
    InsertMove(&indexOpnd->super_Opnd,&pIVar9->super_Opnd,callInstr,true);
  }
  else {
    InsertMove(&indexOpnd->super_Opnd,&opnd->super_Opnd,callInstr,true);
  }
  this_00 = (Lowerer *)0x0;
  pIVar8 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
  InsertCompareBranch(this_00,&indexOpnd->super_Opnd,&pIVar8->super_Opnd,BrEq_A,true,
                      bailOutLabelHelper,callInstr,false);
  pIVar8 = IR::IntConstOpnd::New(1,TyUint32,this->m_func,false);
  InsertSub(false,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar8->super_Opnd,callInstr);
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpndParam,indexOpnd,TyVar,this->m_func);
  IR::Opnd::SetValueType(&pIVar9->m_baseOpnd->super_Opnd,(ValueType)local_34.field_0);
  pIVar9 = GenerateFastElemICommon
                     (this,callInstr,false,pIVar9,labelHelper,labelHelper,(LabelInstr *)0x0,local_31
                      ,&local_35,(bool *)0x0,(Opnd **)0x0,(LabelInstr **)0x0,true,false,false,
                      bailOutLabelHelper,(bool *)0x0,FldInfo_NoInfo);
  if (local_31[0] == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5372,"(!isTypedArrayElement)","!isTypedArrayElement");
    if (!bVar2) goto LAB_005eb25b;
    *puVar5 = 0;
  }
  if (pIVar9 == (IndirOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5373,"(indirOpnd)","indirOpnd");
    if (!bVar2) {
LAB_005eb25b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseBaseOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
  return true;
}

Assistant:

bool Lowerer::GenerateFastPop(IR::Opnd *baseOpndParam, IR::Instr *callInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel, IR::LabelInstr * bailOutLabelHelper)
{
    Assert(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false));

    //     TEST baseOpnd, AtomTag                  -- check baseOpnd not tagged int
    //     JNE $helper
    //     CMP [baseOpnd], JavascriptArray::`vtable' -- check baseOpnd isArray
    //     JNE $helper
    //     MOV r2, [baseOpnd + offset(length)]     -- Load array length

    IR::RegOpnd *       baseOpnd = baseOpndParam->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);

    ValueType arrValueType(baseOpndParam->GetValueType());
    IR::RegOpnd *arrayOpnd = baseOpnd;
    IR::RegOpnd *arrayLengthOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
    if(!arrValueType.IsAnyOptimizedArray())
    {
        arrayOpnd = GenerateArrayTest(baseOpnd, bailOutLabelHelper, bailOutLabelHelper, callInstr, false, true);
        arrValueType = arrayOpnd->GetValueType().ToDefiniteObject().SetHasNoMissingValues(false);
    }
    else if(arrayOpnd->IsArrayRegOpnd())
    {
        IR::ArrayRegOpnd *const arrayRegOpnd = arrayOpnd->AsArrayRegOpnd();
        if(arrayRegOpnd->LengthSym())
        {
            arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), arrayRegOpnd->LengthSym()->GetType(), m_func);
            DebugOnly(arrayLengthOpnd->FreezeSymValue());
            autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        }
    }
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

    IR::AutoReuseOpnd autoReuseMutableArrayLengthOpnd;
    {
        IR::RegOpnd *const mutableArrayLengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
        autoReuseMutableArrayLengthOpnd.Initialize(mutableArrayLengthOpnd, m_func);
        if(arrayLengthOpnd)
        {
            // mov mutableArrayLength, arrayLength
            InsertMove(mutableArrayLengthOpnd, arrayLengthOpnd, callInstr);
        }
        else
        {
            // MOV mutableArrayLength, [array + offset(length)]     -- Load array length
            // We know this index is safe since, so mark it as UInt32 to avoid unnecessary conversion/checks
            InsertMove(
                mutableArrayLengthOpnd,
                IR::IndirOpnd::New(
                    arrayOpnd,
                    Js::JavascriptArray::GetOffsetOfLength(),
                    mutableArrayLengthOpnd->GetType(),
                    this->m_func),
                callInstr);
        }
        arrayLengthOpnd = mutableArrayLengthOpnd;
    }

    InsertCompareBranch(arrayLengthOpnd, IR::IntConstOpnd::New(0, TyUint32, this->m_func), Js::OpCode::BrEq_A, true, bailOutLabelHelper, callInstr);
    InsertSub(false, arrayLengthOpnd, arrayLengthOpnd, IR::IntConstOpnd::New(1, TyUint32, this->m_func),callInstr);

    IR::IndirOpnd *arrayRef = IR::IndirOpnd::New(arrayOpnd, arrayLengthOpnd, TyVar, this->m_func);
    arrayRef->GetBaseOpnd()->SetValueType(arrValueType);

    //Array length is going to overflow, hence don't check for Array.length and Segment.length overflow.
    bool isTypedArrayElement, isStringIndex;
    IR::IndirOpnd *const indirOpnd =
        GenerateFastElemICommon(
            callInstr,
            false,
            arrayRef,
            labelHelper,
            labelHelper,
            nullptr,
            &isTypedArrayElement,
            &isStringIndex,
            nullptr,
            nullptr,
            nullptr /*pLabelSegmentLengthIncreased*/,
            true /*checkArrayLengthOverflow*/,
            true /* forceGenerateFastPath */,
            false/* = returnLength */,
            bailOutLabelHelper /* = bailOutLabelInstr*/);
    Assert(!isTypedArrayElement);
    Assert(indirOpnd);
    return true;
}